

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O2

string * LicenseInfo_abi_cxx11_(void)

{
  char *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char (*in_R8) [38];
  long in_FS_OFFSET;
  string URL_SOURCE_CODE;
  int local_378;
  undefined1 local_374 [36];
  tinyformat local_350 [32];
  string local_330;
  bilingual_str local_310;
  undefined1 local_2d0 [64];
  string local_290;
  undefined1 local_270 [64];
  string local_230;
  undefined1 local_210 [64];
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"<https://github.com/bitcoin/bitcoin>",(allocator<char> *)local_210
            );
  _((bilingual_str *)local_210,(ConstevalStringLiteral)0x43ae16);
  local_374._0_4_ = 0x7d9;
  local_378 = 0x7e8;
  tinyformat::format<int,int>
            (&local_1d0,(tinyformat *)(local_210 + 0x20),(string *)local_374,&local_378,(int *)in_R8
            );
  std::operator+(&local_1b0,&local_1d0," ");
  CopyrightHolders(&local_190,&local_1b0);
  std::operator+(&local_170,&local_190,"\n");
  std::operator+(&local_150,&local_170,"\n");
  _((bilingual_str *)local_270,(ConstevalStringLiteral)0x43ae2a);
  args = "<https://bitcoincore.org/>";
  tinyformat::format<char[13],char[27]>
            (&local_230,(tinyformat *)(local_270 + 0x20),(string *)"Bitcoin Core",
             (char (*) [13])"<https://bitcoincore.org/>",(char (*) [27])in_R8);
  std::operator+(&local_130,&local_150,&local_230);
  std::operator+(&local_110,&local_130,"\n");
  _((bilingual_str *)local_2d0,(ConstevalStringLiteral)0x43aea3);
  tinyformat::format<std::__cxx11::string>
            (&local_290,(tinyformat *)(local_2d0 + 0x20),&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  std::operator+(&local_f0,&local_110,&local_290);
  std::operator+(&local_d0,&local_f0,"\n");
  std::operator+(&local_b0,&local_d0,"\n");
  _(&local_310,(ConstevalStringLiteral)0x43aec9);
  std::operator+(&local_90,&local_b0,&local_310.translated);
  std::operator+(&local_70,&local_90,"\n");
  _((bilingual_str *)(local_374 + 4),(ConstevalStringLiteral)0x43aee8);
  tinyformat::format<char[8],char[38]>
            (&local_330,local_350,(string *)"COPYING",
             (char (*) [8])"<https://opensource.org/licenses/MIT>",in_R8);
  std::operator+(&local_50,&local_70,&local_330);
  std::operator+(in_RDI,&local_50,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_330);
  bilingual_str::~bilingual_str((bilingual_str *)(local_374 + 4));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  bilingual_str::~bilingual_str(&local_310);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_290);
  bilingual_str::~bilingual_str((bilingual_str *)local_2d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_230);
  bilingual_str::~bilingual_str((bilingual_str *)local_270);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  bilingual_str::~bilingual_str((bilingual_str *)local_210);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string LicenseInfo()
{
    const std::string URL_SOURCE_CODE = "<https://github.com/bitcoin/bitcoin>";

    return CopyrightHolders(strprintf(_("Copyright (C) %i-%i").translated, 2009, COPYRIGHT_YEAR) + " ") + "\n" +
           "\n" +
           strprintf(_("Please contribute if you find %s useful. "
                       "Visit %s for further information about the software.").translated, PACKAGE_NAME, "<" PACKAGE_URL ">") +
           "\n" +
           strprintf(_("The source code is available from %s.").translated, URL_SOURCE_CODE) +
           "\n" +
           "\n" +
           _("This is experimental software.").translated + "\n" +
           strprintf(_("Distributed under the MIT software license, see the accompanying file %s or %s").translated, "COPYING", "<https://opensource.org/licenses/MIT>") +
           "\n";
}